

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O0

int32_t spvOpcodeIsComposite(Op opcode)

{
  int32_t local_c;
  Op opcode_local;
  
  if ((((opcode - OpTypeVector < 2) || (opcode - OpTypeArray < 3)) ||
      (opcode == OpTypeCooperativeMatrixKHR)) ||
     ((opcode == OpTypeCooperativeVectorNV || (opcode == OpTypeCooperativeMatrixNV)))) {
    local_c = 1;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int32_t spvOpcodeIsComposite(const spv::Op opcode) {
  switch (opcode) {
    case spv::Op::OpTypeVector:
    case spv::Op::OpTypeMatrix:
    case spv::Op::OpTypeArray:
    case spv::Op::OpTypeStruct:
    case spv::Op::OpTypeRuntimeArray:
    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
    case spv::Op::OpTypeCooperativeVectorNV:
      return true;
    default:
      return false;
  }
}